

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void VerifyHash(void *key,int len,uint32_t seed,void *out)

{
  uint32_t seed_local;
  
  seed_local = seed;
  g_inputVCode = MurmurOAAT((char *)key,len,g_inputVCode);
  g_inputVCode = MurmurOAAT((char *)&seed_local,4,g_inputVCode);
  (*g_hashUnderTest->hash)(key,len,seed_local,out);
  g_outputVCode = MurmurOAAT((char *)out,g_hashUnderTest->hashbits / 8,g_outputVCode);
  return;
}

Assistant:

void VerifyHash ( const void * key, int len, uint32_t seed, void * out )
{
  g_inputVCode = MurmurOAAT((const char *)key, len, g_inputVCode);
  g_inputVCode = MurmurOAAT((const char *)&seed, sizeof(uint32_t), g_inputVCode);

  g_hashUnderTest->hash(key, len, seed, out);

  g_outputVCode = MurmurOAAT((const char *)out, g_hashUnderTest->hashbits/8, g_outputVCode);
}